

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSAify.cpp
# Opt level: O2

void __thiscall wasm::SSAify::~SSAify(SSAify *this)

{
  ~SSAify(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }